

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O0

void __thiscall bioparser::test::BioparserMhapTest::Check(BioparserMhapTest *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_90;
  Message local_88 [2];
  unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>
  *local_78;
  unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>
  *local_70;
  int local_68 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  size_type local_30;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  BioparserMhapTest *this_local;
  
  local_24 = 0x96;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_30 = std::
             vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
             ::size(&this->o);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_20,"150","o.size()",&local_24,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/mhap_parser_test.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_68[1] = 0x7745d4;
  local_70 = (unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>
              *)std::
                vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
                ::begin(&this->o);
  local_78 = (unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>
              *)std::
                vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
                ::end(&this->o);
  local_68[0] = std::
                accumulate<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>*,std::vector<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>,std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>>>>,int,bioparser::test::BioparserMhapTest::Check()::_lambda(unsigned_int,std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>const&)_1_>
                          (local_70,local_78,0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_60,"7816660",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<MhapOverlap>& it) { return s + it->lhs_id + it->lhs_begin + it->lhs_end + it->lhs_len + it->rhs_id + it->rhs_begin + it->rhs_end + it->rhs_len + it->score + it->strand + it->error; })"
             ,local_68 + 1,local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/mhap_parser_test.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

void Check() {
    EXPECT_EQ(150, o.size());
    EXPECT_EQ(7816660, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<MhapOverlap>& it) {
          return s +
              it->lhs_id + it->lhs_begin + it->lhs_end + it->lhs_len +
              it->rhs_id + it->rhs_begin + it->rhs_end + it->rhs_len +
              it->score +
              it->strand +
              it->error;
        }));
  }